

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
::operator=(SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
            *this,SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
                  *RHS)

{
  bool bVar1;
  iterator MinSize;
  iterator pIVar2;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
  *local_f0;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
  *RHS_local;
  SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
  *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
            ::isSmall((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                       *)RHS);
    if (bVar1) {
      MinSize = (iterator)
                (((long)(RHS->
                        super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                        .super_SmallVectorBase.EndX -
                 (long)(RHS->
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                       ).
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                       .super_SmallVectorBase.BeginX) / 0x168);
      NewEnd = (iterator)
               (((long)(this->
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                       ).
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                       .super_SmallVectorBase.EndX -
                (long)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.BeginX) / 0x168);
      if (NewEnd < MinSize) {
        pIVar2 = (iterator)
                 SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                 ::capacity((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                             *)this);
        if (pIVar2 < MinSize) {
          SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
          ::destroy_range((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                           *)(this->
                             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                             ).
                             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                             .super_SmallVectorBase.BeginX,
                          (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                           *)(this->
                             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                             ).
                             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                             .super_SmallVectorBase.EndX);
          SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
          ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                    *)this,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                            *)(this->
                              super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                              ).
                              super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                              .super_SmallVectorBase.BeginX);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
          ::grow(&this->
                  super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                 ,(size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          std::
          move<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*>
                    ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                      *)(RHS->
                        super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                        .super_SmallVectorBase.BeginX,
                     (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                      *)((long)(RHS->
                               super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                               ).
                               super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                               .super_SmallVectorBase.BeginX + (long)NewEnd * 0x168),
                     (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                      *)(this->
                        super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                        .super_SmallVectorBase.BeginX);
        }
        SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>,false>
        ::
        uninitialized_move<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*>
                  ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                    *)((long)(RHS->
                             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                             ).
                             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                             .super_SmallVectorBase.BeginX + (long)NewEnd * 0x168),
                   (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                    *)(RHS->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.EndX,
                   (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                    *)((long)(this->
                             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                             ).
                             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                             .super_SmallVectorBase.BeginX + (long)NewEnd * 0x168));
        SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
        ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                  *)this,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                          *)((long)(this->
                                   super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                                   ).
                                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                                   .super_SmallVectorBase.BeginX + (long)MinSize * 0x168));
        clear(RHS);
      }
      else {
        local_f0 = (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                    *)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.BeginX;
        if (MinSize != (iterator)0x0) {
          local_f0 = std::
                     move<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*,Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>*>
                               ((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                                 *)(RHS->
                                   super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                                   ).
                                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                                   .super_SmallVectorBase.BeginX,
                                (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                                 *)(RHS->
                                   super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                                   ).
                                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                                   .super_SmallVectorBase.EndX,local_f0);
        }
        SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
        ::destroy_range(local_f0,(InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                                  *)(this->
                                    super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                                    ).
                                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                                    .super_SmallVectorBase.EndX);
        SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
        ::setEnd((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                  *)this,local_f0);
        clear(RHS);
      }
    }
    else {
      SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
      ::destroy_range((InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                       *)(this->
                         super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                         ).
                         super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                         .super_SmallVectorBase.BeginX,
                      (InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>
                       *)(this->
                         super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
                         ).
                         super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                         .super_SmallVectorBase.EndX);
      bVar1 = SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
              ::isSmall((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                         *)this);
      if (!bVar1) {
        free((this->
             super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
             .super_SmallVectorBase.BeginX);
      }
      (this->
      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
      ).
      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
      .super_SmallVectorBase.BeginX =
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
           .super_SmallVectorBase.BeginX;
      (this->
      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
      ).
      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
      .super_SmallVectorBase.EndX =
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
           .super_SmallVectorBase.EndX;
      (this->
      super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
      ).
      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
      .super_SmallVectorBase.CapacityX =
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
           .super_SmallVectorBase.CapacityX;
      SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
      ::resetToSmall((SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
                      *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}